

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O2

void __thiscall
base_iterator_matrix_sparse_element_test::SetUp(base_iterator_matrix_sparse_element_test *this)

{
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined1 *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_38 = 0;
  uStack_34 = 1;
  uStack_30 = 2;
  uStack_2c = 3;
  local_28 = (undefined1 *)CONCAT44(local_28._4_4_,4);
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&this->columns,&local_38);
  local_28 = &DAT_4008000000000000;
  uStack_20 = 0x4010000000000000;
  local_38 = 0;
  uStack_34 = 0x3ff00000;
  uStack_30 = 0;
  uStack_2c = 0x40000000;
  local_18 = 0x4014000000000000;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&this->entries,&local_38,
             &stack0xfffffffffffffff0);
  return;
}

Assistant:

void SetUp() override {
    // Set up test data
    columns = {0, 1, 2, 3, 4};
    entries = {1.0, 2.0, 3.0, 4.0, 5.0};
  }